

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O2

bool __thiscall
crnlib::clusterizer<crnlib::vec<6U,_float>_>::generate_codebook
          (clusterizer<crnlib::vec<6U,_float>_> *this,uint max_size,
          progress_callback_func_ptr pProgress_callback,void *pProgress_data,bool quick)

{
  node_vec_type *this_00;
  uint *puVar1;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *lhs;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar2;
  uint *puVar3;
  vq_node *pvVar4;
  bool bVar5;
  float fVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint i;
  ulong uVar12;
  float fVar13;
  uint local_cc;
  vector<unsigned_int> *local_c8;
  int local_bc;
  progress_callback_func_ptr local_b8;
  void *local_b0;
  vector<unsigned_int> *local_a8;
  vector<unsigned_int> *local_a0;
  vq_node root;
  vec<6U,_float> local_48;
  
  uVar8 = (this->m_training_vecs).m_size;
  if (uVar8 == 0) {
    return false;
  }
  this->m_quick = quick;
  root.m_vectors.m_p = (uint *)0x0;
  root.m_vectors.m_size = 0;
  root.m_vectors.m_capacity = 0;
  root.m_centroid.m_s[0] = 0.0;
  root.m_centroid.m_s[1] = 0.0;
  root.m_centroid.m_s[2] = 0.0;
  root.m_centroid.m_s[3] = 0.0;
  root.m_centroid.m_s[4] = 0.0;
  root.m_centroid.m_s[5] = 0.0;
  root.m_total_weight = 0;
  root.m_left = -1;
  root.m_right = -1;
  root.m_codebook_index = -1;
  root.m_unsplittable = false;
  local_b8 = pProgress_callback;
  local_b0 = pProgress_data;
  vector<unsigned_int>::reserve(&root.m_vectors,uVar8);
  fVar6 = 0.0;
  for (local_cc = 0; local_cc < (this->m_training_vecs).m_size; local_cc = local_cc + 1) {
    ppVar2 = (this->m_training_vecs).m_p;
    lhs = ppVar2 + local_cc;
    uVar12 = (ulong)ppVar2[local_cc].second;
    fVar13 = (float)uVar12;
    local_c8 = (vector<unsigned_int> *)CONCAT44(local_c8._4_4_,fVar13);
    operator*(&lhs->first,fVar13);
    vec<6U,_float>::operator+=(&root.m_centroid,&local_48);
    root.m_total_weight = root.m_total_weight + uVar12;
    vector<unsigned_int>::push_back(&root.m_vectors,&local_cc);
    fVar13 = operator*(&lhs->first,&lhs->first);
    fVar6 = fVar6 + fVar13 * local_c8._0_4_;
  }
  fVar13 = operator*(&root.m_centroid,&root.m_centroid);
  root.m_variance = fVar6 - fVar13 / (float)root.m_total_weight;
  vec<6U,_float>::operator*=(&root.m_centroid,1.0 / (float)root.m_total_weight);
  this_00 = &this->m_nodes;
  vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::clear(this_00);
  vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::reserve(this_00,max_size * 2 + 1);
  vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::push_back(this_00,&root);
  vector<unsigned_int>::resize(&this->m_heap,max_size + 1,false);
  (this->m_heap).m_p[1] = 0;
  this->m_heap_size = 1;
  this->m_split_index = 0;
  local_a0 = &this->m_left_children;
  local_c8 = &this->m_heap;
  vector<unsigned_int>::reserve(local_a0,(this->m_training_vecs).m_size + 1);
  local_a8 = &this->m_right_children;
  vector<unsigned_int>::reserve(local_a8,(this->m_training_vecs).m_size + 1);
  local_bc = (max_size >> 1) + 100;
  uVar10 = 1;
  uVar12 = 0xffffffffffffffff;
LAB_00138983:
  uVar9 = uVar10 * 100 + local_bc;
  do {
    bVar5 = this->m_heap_size == 0 || max_size <= uVar10;
    if (bVar5) {
      vector<crnlib::vec<6U,_float>_>::clear(&this->m_codebook);
      this->m_overall_variance = 0.0;
      lVar11 = 0;
      for (uVar12 = 0; uVar12 < (this->m_nodes).m_size; uVar12 = uVar12 + 1) {
        pvVar4 = this_00->m_p;
        if (*(int *)((long)(&pvVar4->m_centroid + 2) + lVar11 + 8) == -1) {
          *(uint *)((long)(&pvVar4->m_centroid + 2) + lVar11 + 0x10) = (this->m_codebook).m_size;
          vector<crnlib::vec<6U,_float>_>::push_back
                    (&this->m_codebook,(vec<6U,_float> *)((long)(pvVar4->m_centroid).m_s + lVar11));
          this->m_overall_variance =
               *(float *)((long)(&pvVar4->m_centroid + 1) + lVar11 + 8) + this->m_overall_variance;
        }
        lVar11 = lVar11 + 0x48;
      }
      vector<unsigned_int>::clear(local_c8);
      vector<unsigned_int>::clear(local_a0);
      vector<unsigned_int>::clear(local_a8);
      goto LAB_00138a90;
    }
    puVar3 = (this->m_heap).m_p;
    uVar8 = puVar3[1];
    puVar3[1] = puVar3[this->m_heap_size];
    puVar1 = &this->m_heap_size;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 != 0) {
      down_heap(this,1);
    }
    split_node(this,uVar8);
    if ((local_b8 != (progress_callback_func_ptr)0x0) && ((uVar10 + 1 & 0x3f) == 0)) {
      uVar8 = (uint)((ulong)uVar9 / (ulong)max_size);
      if (uVar8 != (uint)uVar12) break;
    }
    uVar9 = uVar9 + 100;
    uVar10 = uVar10 + 1;
  } while( true );
  bVar7 = (*local_b8)(uVar8,local_b0);
  uVar10 = uVar10 + 1;
  uVar12 = (ulong)uVar9 / (ulong)max_size;
  if (!bVar7) {
LAB_00138a90:
    vector<unsigned_int>::~vector(&root.m_vectors);
    return bVar5;
  }
  goto LAB_00138983;
}

Assistant:

bool generate_codebook(uint max_size, progress_callback_func_ptr pProgress_callback = NULL, void* pProgress_data = NULL, bool quick = false) {
    if (m_training_vecs.empty())
      return false;

    m_quick = quick;

    double ttsum = 0.0f;

    vq_node root;
    root.m_vectors.reserve(m_training_vecs.size());

    for (uint i = 0; i < m_training_vecs.size(); i++) {
      const VectorType& v = m_training_vecs[i].first;
      const uint weight = m_training_vecs[i].second;

      root.m_centroid += (v * (float)weight);
      root.m_total_weight += weight;
      root.m_vectors.push_back(i);

      ttsum += v.dot(v) * weight;
    }

    root.m_variance = (float)(ttsum - (root.m_centroid.dot(root.m_centroid) / root.m_total_weight));

    root.m_centroid *= (1.0f / root.m_total_weight);

    m_nodes.clear();
    m_nodes.reserve(max_size * 2 + 1);

    m_nodes.push_back(root);

    m_heap.resize(max_size + 1);
    m_heap[1] = 0;
    m_heap_size = 1;

    m_split_index = 0;

    uint total_leaves = 1;

    m_left_children.reserve(m_training_vecs.size() + 1);
    m_right_children.reserve(m_training_vecs.size() + 1);

    int prev_percentage = -1;
    while ((total_leaves < max_size) && (m_heap_size)) {
      int worst_node_index = m_heap[1];

      m_heap[1] = m_heap[m_heap_size];
      m_heap_size--;
      if (m_heap_size)
        down_heap(1);

      split_node(worst_node_index);
      total_leaves++;

      if ((pProgress_callback) && ((total_leaves & 63) == 0) && (max_size)) {
        int cur_percentage = (total_leaves * 100U + (max_size / 2U)) / max_size;
        if (cur_percentage != prev_percentage) {
          if (!(*pProgress_callback)(cur_percentage, pProgress_data))
            return false;

          prev_percentage = cur_percentage;
        }
      }
    }

    m_codebook.clear();

    m_overall_variance = 0.0f;

    for (uint i = 0; i < m_nodes.size(); i++) {
      vq_node& node = m_nodes[i];
      if (node.m_left != -1) {
        CRNLIB_ASSERT(node.m_right != -1);
        continue;
      }

      CRNLIB_ASSERT((node.m_left == -1) && (node.m_right == -1));

      node.m_codebook_index = m_codebook.size();
      m_codebook.push_back(node.m_centroid);

      m_overall_variance += node.m_variance;
    }

    m_heap.clear();
    m_left_children.clear();
    m_right_children.clear();

    return true;
  }